

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setReorderArrays
          (CollationSettings *this,int32_t *codes,int32_t codesLength,uint32_t *ranges,
          int32_t rangesLength,uint8_t *table,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t capacity;
  int32_t totalLength;
  int32_t *ownedCodes;
  uint8_t *table_local;
  int32_t rangesLength_local;
  uint32_t *ranges_local;
  int32_t codesLength_local;
  int32_t *codes_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (this->reorderCodesCapacity < codesLength + rangesLength) {
      uVar2 = codesLength + rangesLength + 3U & 0xfffffffc;
      _capacity = (int32_t *)uprv_malloc_63((long)(int)(uVar2 * 4 + 0x100));
      if (_capacity == (int32_t *)0x0) {
        resetReordering(this);
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      if (this->reorderCodesCapacity != 0) {
        uprv_free_63(this->reorderCodes);
      }
      this->reorderCodes = _capacity;
      this->reorderCodesCapacity = uVar2;
    }
    else {
      _capacity = this->reorderCodes;
    }
    memcpy(_capacity + this->reorderCodesCapacity,table,0x100);
    memcpy(_capacity,codes,(long)(codesLength << 2));
    memcpy(_capacity + codesLength,ranges,(long)(rangesLength << 2));
    this->reorderTable = (uint8_t *)(this->reorderCodes + this->reorderCodesCapacity);
    this->reorderCodesLength = codesLength;
    this->reorderRanges = (uint32_t *)(_capacity + codesLength);
    this->reorderRangesLength = rangesLength;
  }
  return;
}

Assistant:

void
CollationSettings::setReorderArrays(const int32_t *codes, int32_t codesLength,
                                    const uint32_t *ranges, int32_t rangesLength,
                                    const uint8_t *table, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t *ownedCodes;
    int32_t totalLength = codesLength + rangesLength;
    U_ASSERT(totalLength > 0);
    if(totalLength <= reorderCodesCapacity) {
        ownedCodes = const_cast<int32_t *>(reorderCodes);
    } else {
        // Allocate one memory block for the codes, the ranges, and the 16-aligned table.
        int32_t capacity = (totalLength + 3) & ~3;  // round up to a multiple of 4 ints
        ownedCodes = (int32_t *)uprv_malloc(capacity * 4 + 256);
        if(ownedCodes == NULL) {
            resetReordering();
            errorCode = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if(reorderCodesCapacity != 0) {
            uprv_free(const_cast<int32_t *>(reorderCodes));
        }
        reorderCodes = ownedCodes;
        reorderCodesCapacity = capacity;
    }
    uprv_memcpy(ownedCodes + reorderCodesCapacity, table, 256);
    uprv_memcpy(ownedCodes, codes, codesLength * 4);
    uprv_memcpy(ownedCodes + codesLength, ranges, rangesLength * 4);
    reorderTable = reinterpret_cast<const uint8_t *>(reorderCodes + reorderCodesCapacity);
    reorderCodesLength = codesLength;
    reorderRanges = reinterpret_cast<uint32_t *>(ownedCodes) + codesLength;
    reorderRangesLength = rangesLength;
}